

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O3

int emulate_compare(int code,reg_type *src1,reg_type *src2)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  short sVar7;
  short sVar8;
  ushort uVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  switch(code) {
  case 0:
  case 1:
    bVar15 = (src1->u).c.c == (src2->u).c.c;
    break;
  case 2:
  case 3:
    bVar15 = (src1->u).s.s == (src2->u).s.s;
    break;
  case 4:
  case 5:
    bVar15 = (src1->u).i.i == (src2->u).i.i;
    break;
  case 6:
  case 7:
  case 8:
    bVar15 = (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
             (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    break;
  case 9:
    bVar15 = *(float *)&src2->u == *(float *)&src1->u;
    goto LAB_0011443b;
  case 10:
    bVar15 = (double)src2->u == (double)src1->u;
    goto LAB_0011443b;
  case 0xb:
    bVar16 = SBORROW1(*(char *)&src1->u,*(char *)&src2->u);
    bVar15 = (char)(*(char *)&src1->u - *(char *)&src2->u) < '\0';
    goto LAB_0011441e;
  case 0xc:
    bVar15 = (byte)(src1->u).c.c < (byte)(src2->u).c.c;
    goto LAB_00114461;
  case 0xd:
    bVar16 = SBORROW2(*(short *)&src1->u,*(short *)&src2->u);
    bVar15 = (short)(*(short *)&src1->u - *(short *)&src2->u) < 0;
    goto LAB_0011441e;
  case 0xe:
    bVar15 = (ushort)(src1->u).s.s < (ushort)(src2->u).s.s;
    goto LAB_00114461;
  case 0xf:
    bVar16 = SBORROW4(*(int *)&src1->u,*(int *)&src2->u);
    bVar15 = *(int *)&src1->u - *(int *)&src2->u < 0;
    goto LAB_0011441e;
  case 0x10:
    bVar15 = (uint)(src1->u).i.i < (uint)(src2->u).i.i;
    goto LAB_00114461;
  case 0x11:
    bVar16 = SBORROW8((long)src1->u,*(long *)&(src2->u).c);
    bVar15 = (long)src1->u - *(long *)&(src2->u).c < 0;
LAB_0011441e:
    bVar15 = bVar16 == bVar15;
    break;
  case 0x12:
  case 0x13:
    bVar15 = (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
             (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    goto LAB_00114461;
  case 0x14:
    bVar15 = *(float *)&src1->u < *(float *)&src2->u;
    goto LAB_00114461;
  case 0x15:
    bVar15 = (double)src1->u < (double)src2->u;
    goto LAB_00114461;
  case 0x16:
    cVar5 = *(char *)&src1->u;
    cVar6 = *(char *)&src2->u;
    bVar17 = SBORROW1(cVar5,cVar6);
    bVar16 = (char)(cVar5 - cVar6) < '\0';
    bVar15 = cVar5 == cVar6;
    goto LAB_0011448e;
  case 0x17:
    bVar3 = (src1->u).c.c;
    bVar4 = (src2->u).c.c;
    bVar16 = bVar3 < bVar4;
    bVar15 = bVar3 == bVar4;
    goto LAB_00114485;
  case 0x18:
    sVar7 = *(short *)&src1->u;
    sVar8 = *(short *)&src2->u;
    bVar17 = SBORROW2(sVar7,sVar8);
    bVar16 = (short)(sVar7 - sVar8) < 0;
    bVar15 = sVar7 == sVar8;
    goto LAB_0011448e;
  case 0x19:
    uVar9 = (src1->u).s.s;
    uVar10 = (src2->u).s.s;
    bVar16 = uVar9 < uVar10;
    bVar15 = uVar9 == uVar10;
    goto LAB_00114485;
  case 0x1a:
    iVar11 = *(int *)&src1->u;
    iVar1 = *(int *)&src2->u;
    bVar17 = SBORROW4(iVar11,iVar1);
    bVar16 = iVar11 - iVar1 < 0;
    bVar15 = iVar11 == iVar1;
    goto LAB_0011448e;
  case 0x1b:
    uVar12 = (src1->u).i.i;
    uVar2 = (src2->u).i.i;
    bVar16 = uVar12 < uVar2;
    bVar15 = uVar12 == uVar2;
    goto LAB_00114485;
  case 0x1c:
    lVar13 = *(long *)&(src1->u).c;
    lVar14 = *(long *)&(src2->u).c;
    bVar17 = SBORROW8(lVar13,lVar14);
    bVar16 = lVar13 - lVar14 < 0;
    bVar15 = lVar13 == lVar14;
LAB_0011448e:
    bVar15 = !bVar15 && bVar17 == bVar16;
    break;
  case 0x1d:
  case 0x1e:
    bVar16 = (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
             (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    bVar15 = (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
             (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    goto LAB_00114485;
  case 0x1f:
    bVar15 = *(float *)&src1->u == *(float *)&src2->u;
    bVar16 = *(float *)&src1->u < *(float *)&src2->u;
    goto LAB_00114485;
  case 0x20:
    bVar15 = *(double *)&(src1->u).c == (double)src2->u;
    bVar16 = *(double *)&(src1->u).c < (double)src2->u;
    goto LAB_00114485;
  case 0x21:
    cVar5 = *(char *)&src1->u;
    cVar6 = *(char *)&src2->u;
    bVar17 = SBORROW1(cVar5,cVar6);
    bVar16 = (char)(cVar5 - cVar6) < '\0';
    bVar15 = cVar5 == cVar6;
    goto LAB_00114455;
  case 0x22:
    bVar3 = (src1->u).c.c;
    bVar4 = (src2->u).c.c;
    bVar15 = bVar3 < bVar4;
    bVar16 = bVar3 == bVar4;
    goto LAB_00114478;
  case 0x23:
    sVar7 = *(short *)&src1->u;
    sVar8 = *(short *)&src2->u;
    bVar17 = SBORROW2(sVar7,sVar8);
    bVar16 = (short)(sVar7 - sVar8) < 0;
    bVar15 = sVar7 == sVar8;
    goto LAB_00114455;
  case 0x24:
    uVar9 = (src1->u).s.s;
    uVar10 = (src2->u).s.s;
    bVar15 = uVar9 < uVar10;
    bVar16 = uVar9 == uVar10;
    goto LAB_00114478;
  case 0x25:
    iVar11 = *(int *)&src1->u;
    iVar1 = *(int *)&src2->u;
    bVar17 = SBORROW4(iVar11,iVar1);
    bVar16 = iVar11 - iVar1 < 0;
    bVar15 = iVar11 == iVar1;
    goto LAB_00114455;
  case 0x26:
    uVar12 = (src1->u).i.i;
    uVar2 = (src2->u).i.i;
    bVar15 = uVar12 < uVar2;
    bVar16 = uVar12 == uVar2;
    goto LAB_00114478;
  case 0x27:
    lVar13 = *(long *)&(src1->u).c;
    lVar14 = *(long *)&(src2->u).c;
    bVar17 = SBORROW8(lVar13,lVar14);
    bVar16 = lVar13 - lVar14 < 0;
    bVar15 = lVar13 == lVar14;
LAB_00114455:
    bVar15 = bVar15 || bVar17 != bVar16;
    break;
  case 0x28:
  case 0x29:
    bVar15 = (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
             (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    bVar16 = (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
             (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
LAB_00114478:
    bVar15 = bVar15 || bVar16;
    break;
  case 0x2a:
    bVar15 = *(float *)&src2->u < *(float *)&src1->u;
    goto LAB_00114461;
  case 0x2b:
    bVar15 = (double)src2->u < (double)src1->u;
LAB_00114461:
    bVar15 = !bVar15;
    break;
  case 0x2c:
    bVar16 = SBORROW1(*(char *)&src1->u,*(char *)&src2->u);
    bVar15 = (char)(*(char *)&src1->u - *(char *)&src2->u) < '\0';
    goto LAB_00114499;
  case 0x2d:
    bVar15 = (byte)(src1->u).c.c < (byte)(src2->u).c.c;
    break;
  case 0x2e:
    bVar16 = SBORROW2(*(short *)&src1->u,*(short *)&src2->u);
    bVar15 = (short)(*(short *)&src1->u - *(short *)&src2->u) < 0;
    goto LAB_00114499;
  case 0x2f:
    bVar15 = (ushort)(src1->u).s.s < (ushort)(src2->u).s.s;
    break;
  case 0x30:
    bVar16 = SBORROW4(*(int *)&src1->u,*(int *)&src2->u);
    bVar15 = *(int *)&src1->u - *(int *)&src2->u < 0;
    goto LAB_00114499;
  case 0x31:
    bVar15 = (uint)(src1->u).i.i < (uint)(src2->u).i.i;
    break;
  case 0x32:
    bVar16 = SBORROW8((long)src1->u,*(long *)&(src2->u).c);
    bVar15 = (long)src1->u - *(long *)&(src2->u).c < 0;
LAB_00114499:
    bVar15 = bVar16 != bVar15;
    break;
  case 0x33:
  case 0x34:
    bVar15 = (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
             (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
    break;
  case 0x35:
    bVar15 = *(float *)&src2->u == *(float *)&src1->u;
    bVar16 = *(float *)&src2->u < *(float *)&src1->u;
    goto LAB_00114485;
  case 0x36:
    bVar15 = *(double *)&(src2->u).c == (double)src1->u;
    bVar16 = *(double *)&(src2->u).c < (double)src1->u;
LAB_00114485:
    bVar15 = !bVar16 && !bVar15;
    break;
  case 0x37:
  case 0x38:
    bVar15 = (src1->u).c.c == (src2->u).c.c;
    goto LAB_00114301;
  case 0x39:
  case 0x3a:
    bVar15 = (src1->u).s.s == (src2->u).s.s;
    goto LAB_00114301;
  case 0x3b:
  case 0x3c:
    bVar15 = (src1->u).i.i == (src2->u).i.i;
    goto LAB_00114301;
  case 0x3d:
  case 0x3e:
  case 0x3f:
    bVar15 = (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
             (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u;
LAB_00114301:
    bVar15 = !bVar15;
    break;
  case 0x40:
    bVar15 = *(float *)&src2->u != *(float *)&src1->u;
    goto LAB_0011443b;
  case 0x41:
    bVar15 = (double)src2->u != (double)src1->u;
LAB_0011443b:
    bVar15 = (bool)(-bVar15 & 1);
    break;
  default:
    bVar15 = false;
  }
  return (int)bVar15;
}

Assistant:

int emulate_compare(int code, struct reg_type *src1, struct reg_type *src2)
{
    switch(code) {
	  case dill_jmp_ceqc:  return ( src1->u.c.c) == ( src2->u.c.c);
	  case dill_jmp_cequc:  return ( src1->u.uc.uc) == ( src2->u.uc.uc);
	  case dill_jmp_ceqs:  return ( src1->u.s.s) == ( src2->u.s.s);
	  case dill_jmp_cequs:  return ( src1->u.us.us) == ( src2->u.us.us);
	  case dill_jmp_ceqi:  return ( src1->u.i.i) == ( src2->u.i.i);
	  case dill_jmp_cequ:  return ( src1->u.u.u) == ( src2->u.u.u);
	  case dill_jmp_cequl:  return ( src1->u.ul.ul) == ( src2->u.ul.ul);
	  case dill_jmp_ceql:  return ( src1->u.l.l) == ( src2->u.l.l);
	  case dill_jmp_ceqp:  return ((char*) src1->u.p.p) == ((char*) src2->u.p.p);
	  case dill_jmp_ceqd:  return ( src1->u.d.d) == ( src2->u.d.d);
	  case dill_jmp_ceqf:  return ( src1->u.f.f) == ( src2->u.f.f);
	  case dill_jmp_cgec:  return ( src1->u.c.c) >= ( src2->u.c.c);
	  case dill_jmp_cgeuc:  return ( src1->u.uc.uc) >= ( src2->u.uc.uc);
	  case dill_jmp_cges:  return ( src1->u.s.s) >= ( src2->u.s.s);
	  case dill_jmp_cgeus:  return ( src1->u.us.us) >= ( src2->u.us.us);
	  case dill_jmp_cgei:  return ( src1->u.i.i) >= ( src2->u.i.i);
	  case dill_jmp_cgeu:  return ( src1->u.u.u) >= ( src2->u.u.u);
	  case dill_jmp_cgeul:  return ( src1->u.ul.ul) >= ( src2->u.ul.ul);
	  case dill_jmp_cgel:  return ( src1->u.l.l) >= ( src2->u.l.l);
	  case dill_jmp_cgep:  return ((char*) src1->u.p.p) >= ((char*) src2->u.p.p);
	  case dill_jmp_cged:  return ( src1->u.d.d) >= ( src2->u.d.d);
	  case dill_jmp_cgef:  return ( src1->u.f.f) >= ( src2->u.f.f);
	  case dill_jmp_cgtc:  return ( src1->u.c.c) > ( src2->u.c.c);
	  case dill_jmp_cgtuc:  return ( src1->u.uc.uc) > ( src2->u.uc.uc);
	  case dill_jmp_cgts:  return ( src1->u.s.s) > ( src2->u.s.s);
	  case dill_jmp_cgtus:  return ( src1->u.us.us) > ( src2->u.us.us);
	  case dill_jmp_cgti:  return ( src1->u.i.i) > ( src2->u.i.i);
	  case dill_jmp_cgtu:  return ( src1->u.u.u) > ( src2->u.u.u);
	  case dill_jmp_cgtul:  return ( src1->u.ul.ul) > ( src2->u.ul.ul);
	  case dill_jmp_cgtl:  return ( src1->u.l.l) > ( src2->u.l.l);
	  case dill_jmp_cgtp:  return ((char*) src1->u.p.p) > ((char*) src2->u.p.p);
	  case dill_jmp_cgtd:  return ( src1->u.d.d) > ( src2->u.d.d);
	  case dill_jmp_cgtf:  return ( src1->u.f.f) > ( src2->u.f.f);
	  case dill_jmp_clec:  return ( src1->u.c.c) <= ( src2->u.c.c);
	  case dill_jmp_cleuc:  return ( src1->u.uc.uc) <= ( src2->u.uc.uc);
	  case dill_jmp_cles:  return ( src1->u.s.s) <= ( src2->u.s.s);
	  case dill_jmp_cleus:  return ( src1->u.us.us) <= ( src2->u.us.us);
	  case dill_jmp_clei:  return ( src1->u.i.i) <= ( src2->u.i.i);
	  case dill_jmp_cleu:  return ( src1->u.u.u) <= ( src2->u.u.u);
	  case dill_jmp_cleul:  return ( src1->u.ul.ul) <= ( src2->u.ul.ul);
	  case dill_jmp_clel:  return ( src1->u.l.l) <= ( src2->u.l.l);
	  case dill_jmp_clep:  return ((char*) src1->u.p.p) <= ((char*) src2->u.p.p);
	  case dill_jmp_cled:  return ( src1->u.d.d) <= ( src2->u.d.d);
	  case dill_jmp_clef:  return ( src1->u.f.f) <= ( src2->u.f.f);
	  case dill_jmp_cltc:  return ( src1->u.c.c) < ( src2->u.c.c);
	  case dill_jmp_cltuc:  return ( src1->u.uc.uc) < ( src2->u.uc.uc);
	  case dill_jmp_clts:  return ( src1->u.s.s) < ( src2->u.s.s);
	  case dill_jmp_cltus:  return ( src1->u.us.us) < ( src2->u.us.us);
	  case dill_jmp_clti:  return ( src1->u.i.i) < ( src2->u.i.i);
	  case dill_jmp_cltu:  return ( src1->u.u.u) < ( src2->u.u.u);
	  case dill_jmp_cltul:  return ( src1->u.ul.ul) < ( src2->u.ul.ul);
	  case dill_jmp_cltl:  return ( src1->u.l.l) < ( src2->u.l.l);
	  case dill_jmp_cltp:  return ((char*) src1->u.p.p) < ((char*) src2->u.p.p);
	  case dill_jmp_cltd:  return ( src1->u.d.d) < ( src2->u.d.d);
	  case dill_jmp_cltf:  return ( src1->u.f.f) < ( src2->u.f.f);
	  case dill_jmp_cnec:  return ( src1->u.c.c) != ( src2->u.c.c);
	  case dill_jmp_cneuc:  return ( src1->u.uc.uc) != ( src2->u.uc.uc);
	  case dill_jmp_cnes:  return ( src1->u.s.s) != ( src2->u.s.s);
	  case dill_jmp_cneus:  return ( src1->u.us.us) != ( src2->u.us.us);
	  case dill_jmp_cnei:  return ( src1->u.i.i) != ( src2->u.i.i);
	  case dill_jmp_cneu:  return ( src1->u.u.u) != ( src2->u.u.u);
	  case dill_jmp_cneul:  return ( src1->u.ul.ul) != ( src2->u.ul.ul);
	  case dill_jmp_cnel:  return ( src1->u.l.l) != ( src2->u.l.l);
	  case dill_jmp_cnep:  return ((char*) src1->u.p.p) != ((char*) src2->u.p.p);
	  case dill_jmp_cned:  return ( src1->u.d.d) != ( src2->u.d.d);
	  case dill_jmp_cnef:  return ( src1->u.f.f) != ( src2->u.f.f);
    }return 0;
}